

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O2

string * __thiscall xs::parseString_abi_cxx11_(string *__return_storage_ptr__,xs *this,char *str)

{
  xs xVar1;
  xs xVar2;
  xs *pxVar3;
  ostringstream o;
  ostringstream local_1a0 [376];
  
  xVar1 = *this;
  if ((xVar1 == (xs)0x27) || (xVar1 == (xs)0x22)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    pxVar3 = this + 1;
    while ((xVar2 = *pxVar3, xVar2 != xVar1 && (xVar2 != (xs)0x0))) {
      if (xVar2 == (xs)0x5c) {
        xVar2 = pxVar3[1];
        if (xVar2 != (xs)0x0) {
          if (xVar2 == (xs)0x74) {
            xVar2 = (xs)0x9;
          }
          else if (xVar2 == (xs)0x6e) {
            xVar2 = (xs)0xa;
          }
          std::operator<<((ostream *)local_1a0,(char)xVar2);
        }
        pxVar3 = pxVar3 + 2;
      }
      else {
        std::operator<<((ostream *)local_1a0,(char)xVar2);
        pxVar3 = pxVar3 + 1;
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,(allocator<char> *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

string parseString (const char* str)
{
	if (str[0] == '\'' || str[0] == '"')
	{
		const char*			p		= str;
		char				endChar = *p++;
		std::ostringstream	o;

		while (*p != endChar && *p)
		{
			if (*p == '\\')
			{
				switch (p[1])
				{
					case 0:		DE_ASSERT(DE_FALSE);	break;
					case 'n':	o << '\n';				break;
					case 't':	o << '\t';				break;
					default:	o << p[1];				break;
				}

				p += 2;
			}
			else
				o << *p++;
		}

		return o.str();
	}
	else
		return string(str);
}